

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cc
# Opt level: O2

Address __thiscall Range::getLastAddrOpen(Range *this,AddrSpaceManager *manage)

{
  pointer ppAVar1;
  AddrSpace *spc;
  uintb uVar2;
  AddrSpaceManager *in_RDX;
  AddrSpaceManager *extraout_RDX;
  AddrSpaceManager *extraout_RDX_00;
  Address AVar3;
  
  spc = (AddrSpace *)manage->_vptr_AddrSpaceManager;
  ppAVar1 = (manage->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppAVar1 == (pointer)spc->highest) {
    spc = AddrSpaceManager::getNextSpaceInOrder(in_RDX,spc);
    if (spc == (AddrSpace *)0x0) {
      Address::Address((Address *)this,m_maximal);
      in_RDX = extraout_RDX_00;
      goto LAB_002627f1;
    }
    uVar2 = 0;
    in_RDX = extraout_RDX;
  }
  else {
    uVar2 = (long)ppAVar1 + 1;
  }
  this->spc = spc;
  this->first = uVar2;
LAB_002627f1:
  AVar3.offset = (uintb)in_RDX;
  AVar3.base = (AddrSpace *)this;
  return AVar3;
}

Assistant:

Address Range::getLastAddrOpen(const AddrSpaceManager *manage) const

{
  AddrSpace *curspc = spc;
  uintb curlast = last;
  if (curlast == curspc->getHighest()) {
    curspc = manage->getNextSpaceInOrder(curspc);
    curlast = 0;
  }
  else
    curlast += 1;
  if (curspc == (AddrSpace *)0)
    return Address(Address::m_maximal);
  return Address(curspc,curlast);
}